

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O0

void __thiscall QTreeView::rowsInserted(QTreeView *this,QModelIndex *parent,int start,int end)

{
  QAbstractItemModel *pQVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  QTreeViewPrivate *this_00;
  const_reference pQVar6;
  reference pQVar7;
  int in_ECX;
  int in_EDX;
  QTreeViewPrivate *in_RSI;
  QWidget *in_RDI;
  int parentItem;
  int delta;
  int parentRowCount;
  QTreeViewPrivate *d;
  int in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  
  this_00 = d_func((QTreeView *)0x8fe228);
  if (((this_00->super_QAbstractItemViewPrivate).delayedPendingLayout & 1U) == 0) {
    iVar3 = QModelIndex::column((QModelIndex *)in_RSI);
    if ((iVar3 == 0) ||
       (bVar2 = QModelIndex::isValid
                          ((QModelIndex *)
                           CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)), !bVar2))
    {
      pQVar1 = (this_00->super_QAbstractItemViewPrivate).model;
      iVar3 = (**(code **)(*(long *)pQVar1 + 0x78))(pQVar1,in_RSI);
      iVar4 = (in_ECX - in_EDX) + 1;
      bVar2 = ::operator!=((QModelIndex *)
                           CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                           (QPersistentModelIndex *)in_RDI);
      if (((!bVar2) ||
          (bVar2 = QTreeViewPrivate::isIndexExpanded(in_RSI,(QModelIndex *)CONCAT44(in_EDX,in_ECX)),
          bVar2)) || (iVar3 <= iVar4)) {
        iVar5 = QTreeViewPrivate::viewIndex((QTreeViewPrivate *)this,parent);
        if (((iVar5 != -1) &&
            (pQVar6 = QList<QTreeViewItem>::at
                                ((QList<QTreeViewItem> *)CONCAT44(iVar5,in_stack_ffffffffffffffd0),
                                 (qsizetype)in_RDI), (*(ulong *)&pQVar6->field_0x1c & 1) != 0)) ||
           (bVar2 = ::operator==((QModelIndex *)CONCAT44(iVar5,in_stack_ffffffffffffffd0),
                                 (QPersistentModelIndex *)in_RDI), bVar2)) {
          QAbstractItemViewPrivate::doDelayedItemsLayout
                    (&this_00->super_QAbstractItemViewPrivate,iVar3);
        }
        else if ((iVar5 != -1) && (iVar3 == iVar4)) {
          pQVar7 = QList<QTreeViewItem>::operator[]
                             ((QList<QTreeViewItem> *)CONCAT44(iVar5,in_stack_ffffffffffffffd0),
                              (qsizetype)in_RDI);
          *(ulong *)&pQVar7->field_0x1c = *(ulong *)&pQVar7->field_0x1c & 0xfffffffffffffffb | 4;
          QAbstractScrollArea::viewport
                    ((QAbstractScrollArea *)CONCAT44(iVar5,in_stack_ffffffffffffffd0));
          QWidget::update(in_RDI);
        }
        QAbstractItemView::rowsInserted
                  ((QAbstractItemView *)this_00,(QModelIndex *)CONCAT44(iVar3,iVar4),iVar5,
                   in_stack_ffffffffffffffd0);
      }
      else {
        QAbstractItemView::rowsInserted
                  ((QAbstractItemView *)this_00,(QModelIndex *)CONCAT44(iVar3,iVar4),
                   in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0);
      }
    }
    else {
      QAbstractItemView::rowsInserted
                ((QAbstractItemView *)this_00,
                 (QModelIndex *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                 in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0);
    }
  }
  else {
    QAbstractItemView::rowsInserted
              ((QAbstractItemView *)this_00,
               (QModelIndex *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
               in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0);
  }
  return;
}

Assistant:

void QTreeView::rowsInserted(const QModelIndex &parent, int start, int end)
{
    Q_D(QTreeView);
    // if we are going to do a complete relayout anyway, there is no need to update
    if (d->delayedPendingLayout) {
        QAbstractItemView::rowsInserted(parent, start, end);
        return;
    }

    //don't add a hierarchy on a column != 0
    if (parent.column() != 0 && parent.isValid()) {
        QAbstractItemView::rowsInserted(parent, start, end);
        return;
    }

    const int parentRowCount = d->model->rowCount(parent);
    const int delta = end - start + 1;
    if (parent != d->root && !d->isIndexExpanded(parent) && parentRowCount > delta) {
        QAbstractItemView::rowsInserted(parent, start, end);
        return;
    }

    const int parentItem = d->viewIndex(parent);
    if (((parentItem != -1) && d->viewItems.at(parentItem).expanded)
        || (parent == d->root)) {
        d->doDelayedItemsLayout();
    } else if (parentItem != -1 && parentRowCount == delta) {
        // the parent just went from 0 children to more. update to re-paint the decoration
        d->viewItems[parentItem].hasChildren = true;
        viewport()->update();
    }
    QAbstractItemView::rowsInserted(parent, start, end);
}